

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O0

mk_rconf_section * mk_rconf_section_add(mk_rconf *conf,char *name)

{
  char *pcVar1;
  mk_rconf_section *new;
  char *name_local;
  mk_rconf *conf_local;
  
  conf_local = (mk_rconf *)mk_mem_alloc(0x28);
  if (conf_local == (mk_rconf *)0x0) {
    conf_local = (mk_rconf *)0x0;
  }
  else {
    pcVar1 = mk_string_dup(name);
    *(char **)conf_local = pcVar1;
    mk_list_init((mk_list *)&conf_local->file);
    mk_list_add(&conf_local->includes,&conf->sections);
  }
  return (mk_rconf_section *)conf_local;
}

Assistant:

struct mk_rconf_section *mk_rconf_section_add(struct mk_rconf *conf,
                                              char *name)
{
    struct mk_rconf_section *new;

    /* Alloc section node */
    new = mk_mem_alloc(sizeof(struct mk_rconf_section));
    if (!new) {
        return NULL;
    }
    new->name = mk_string_dup(name);
    mk_list_init(&new->entries);
    mk_list_add(&new->_head, &conf->sections);

    return new;
}